

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_close_self_timer_expire_fails(void)

{
  cio_error cVar1;
  cio_error err;
  
  cio_timer_expires_from_now_fake.custom_fake =
       (_func_cio_error_cio_timer_ptr_uint64_t_cio_timer_handler_t_void_ptr *)0x0;
  cio_timer_expires_from_now_fake.return_val = CIO_ADDRESS_IN_USE;
  cVar1 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,"Going away",close_handler,(void *)0x0);
  UnityAssertEqualNumber
            (-0x62,(long)cVar1,"Close not failed correctly",0x874,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)cio_timer_cancel_fake.call_count,"Timer cancel was called",0x875,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)cio_timer_close_fake.call_count,"Timer close was called",0x876,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_close_self_timer_expire_fails(void)
{
	cio_timer_expires_from_now_fake.custom_fake = NULL;
	cio_timer_expires_from_now_fake.return_val = CIO_ADDRESS_IN_USE;

	enum cio_error err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, "Going away", close_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_ADDRESS_IN_USE, err, "Close not failed correctly");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_timer_cancel_fake.call_count, "Timer cancel was called");
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_timer_close_fake.call_count, "Timer close was called");
}